

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnLoopExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  pointer pBVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_40;
  Enum local_34;
  ExprList *local_30;
  ExprList *expr_list;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  local_20;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  expr;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  expr._M_t.
  super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)26>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)26>_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>,_true,_true>
        )(__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>,_true,_true>
          )this;
  this_local._0_4_ = sig_type.enum_;
  MakeUnique<wabt::BlockExprBase<(wabt::ExprType)26>>();
  pBVar2 = std::
           unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
           ::operator->(&local_20);
  expr_list._4_4_ = this_local._0_4_;
  SetBlockDeclaration(this,&(pBVar2->block).decl,this_local._0_4_);
  pBVar2 = std::
           unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
           ::operator->(&local_20);
  local_30 = &(pBVar2->block).exprs;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_40,&local_20);
  local_34 = (Enum)AppendExpr(this,&local_40);
  bVar1 = Failed((Result)local_34);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_40);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,Loop,local_30,(Expr *)0x0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  ::~unique_ptr(&local_20);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnLoopExpr(Type sig_type) {
  auto expr = MakeUnique<LoopExpr>();
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::Loop, expr_list);
  return Result::Ok;
}